

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O1

int done_testing(void)

{
  int iVar1;
  
  if (test_level != 0) {
    iVar1 = 0;
    do {
      printf("    ");
      iVar1 = iVar1 + 1;
    } while (iVar1 != test_level);
  }
  printf("1..%d\n",(ulong)(test_index[test_level] - 1));
  fflush(_stdout);
  return test_fail[test_level];
}

Assistant:

static void indent(void)
{
    int i;
    for (i = 0; i != test_level; ++i)
        printf("    ");
}